

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

int __thiscall phosg::Poll::remove(Poll *this,char *__filename)

{
  pointer ppVar1;
  pointer __dest;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  char in_DL;
  pointer ppVar6;
  ulong uVar7;
  
  ppVar1 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar6 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = (int)__filename;
  uVar7 = (long)ppVar6 - (long)ppVar1 >> 3;
  while (__dest = ppVar1, 0 < (long)uVar7) {
    uVar5 = uVar7 >> 1;
    uVar7 = ~uVar5 + uVar7;
    ppVar1 = __dest + uVar5 + 1;
    if (iVar3 <= __dest[uVar5].fd) {
      ppVar1 = __dest;
      uVar7 = uVar5;
    }
  }
  iVar2 = (int)uVar7;
  if ((__dest != ppVar6) && (__dest->fd == iVar3)) {
    ppVar1 = __dest + 1;
    if (ppVar1 != ppVar6) {
      pvVar4 = memmove(__dest,ppVar1,(long)ppVar6 - (long)ppVar1);
      iVar2 = (int)pvVar4;
      ppVar6 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar6 + -1;
    if (in_DL != '\0') {
      iVar3 = close(iVar3);
      return iVar3;
    }
  }
  return iVar2;
}

Assistant:

void Poll::remove(int fd, bool close_fd) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  auto erase_it = lower_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (erase_it != this->poll_fds.end() && erase_it->fd == fd) {
    this->poll_fds.erase(erase_it);
    if (close_fd) {
      close(fd);
    }
  }
}